

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_name_match.cc
# Opt level: O2

bool bssl::anon_unknown_1::VerifyNameMatchInternal(Input a,Input b,NameMatchType match_type)

{
  X509NameAttribute attribute;
  X509NameAttribute attribute_00;
  bool bVar1;
  __type _Var2;
  pointer pXVar3;
  pointer pXVar4;
  pointer pXVar5;
  RelativeDistinguishedName b_type_and_values;
  RelativeDistinguishedName a_type_and_values;
  string b_normalized;
  string a_normalized;
  Parser b_rdn_sequence;
  Parser b_rdn;
  Parser a_rdn;
  Parser a_rdn_sequence;
  Parser b_rdn_sequence_counter;
  Parser a_rdn_sequence_counter;
  _Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_> local_208;
  pointer local_1f0;
  _Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_> local_1e8;
  uchar *local_1c8;
  size_t sStack_1c0;
  undefined8 local_1b8;
  uchar *puStack_1b0;
  size_t local_1a8;
  string local_198;
  uchar *local_178;
  size_t sStack_170;
  undefined8 local_168;
  uchar *puStack_160;
  size_t local_158;
  string local_148;
  uchar *local_128;
  size_t sStack_120;
  undefined8 local_118;
  uchar *puStack_110;
  size_t local_108;
  Parser local_100;
  Parser local_e8;
  Parser local_d0;
  Parser local_b8;
  Parser local_a0;
  Parser local_88;
  CertErrors local_70;
  uchar *local_58;
  size_t sStack_50;
  undefined8 local_48;
  uchar *puStack_40;
  size_t local_38;
  
  local_1f0 = (pointer)CONCAT44(local_1f0._4_4_,match_type);
  bssl::der::Parser::Parser(&local_88,a);
  bssl::der::Parser::Parser(&local_a0,b);
  while ((bVar1 = bssl::der::Parser::HasMore(&local_88), bVar1 &&
         (bVar1 = bssl::der::Parser::HasMore(&local_a0), bVar1))) {
    bVar1 = bssl::der::Parser::SkipTag(&local_88,0x20000011);
    if (!bVar1) {
      return false;
    }
    bVar1 = bssl::der::Parser::SkipTag(&local_a0,0x20000011);
    if (!bVar1) {
      return false;
    }
  }
  bVar1 = bssl::der::Parser::HasMore(&local_a0);
  if ((bVar1) || (((int)local_1f0 == 0 && (bVar1 = bssl::der::Parser::HasMore(&local_88), bVar1))))
  {
    return false;
  }
  bssl::der::Parser::Parser(&local_b8,a);
  bssl::der::Parser::Parser(&local_100,b);
  while( true ) {
    bVar1 = bssl::der::Parser::HasMore(&local_b8);
    if (!bVar1) {
      return true;
    }
    bVar1 = bssl::der::Parser::HasMore(&local_100);
    if (!bVar1) {
      return true;
    }
    bssl::der::Parser::Parser(&local_d0);
    bssl::der::Parser::Parser(&local_e8);
    bVar1 = bssl::der::Parser::ReadConstructed(&local_b8,0x20000011,&local_d0);
    if (!bVar1) {
      return false;
    }
    bVar1 = bssl::der::Parser::ReadConstructed(&local_100,0x20000011,&local_e8);
    if (!bVar1) {
      return false;
    }
    local_1e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_208._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_208._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_208._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ReadRdn(&local_d0,(RelativeDistinguishedName *)&local_1e8);
    if (((!bVar1) || (bVar1 = ReadRdn(&local_e8,(RelativeDistinguishedName *)&local_208), !bVar1))
       || (local_1f0 = local_1e8._M_impl.super__Vector_impl_data._M_finish,
          pXVar4 = local_1e8._M_impl.super__Vector_impl_data._M_start,
          (long)local_1e8._M_impl.super__Vector_impl_data._M_finish -
          (long)local_1e8._M_impl.super__Vector_impl_data._M_start !=
          (long)local_208._M_impl.super__Vector_impl_data._M_finish -
          (long)local_208._M_impl.super__Vector_impl_data._M_start)) break;
    for (; pXVar5 = local_208._M_impl.super__Vector_impl_data._M_start, pXVar4 != local_1f0;
        pXVar4 = pXVar4 + 1) {
      for (; pXVar3 = local_208._M_impl.super__Vector_impl_data._M_finish,
          pXVar5 != local_208._M_impl.super__Vector_impl_data._M_finish; pXVar5 = pXVar5 + 1) {
        bVar1 = bssl::der::operator==((Input)(pXVar4->type).data_,(Input)(pXVar5->type).data_);
        if (bVar1) {
          local_158 = (pXVar4->value).data_.size_;
          local_178 = (pXVar4->type).data_.data_;
          sStack_170 = (pXVar4->type).data_.size_;
          local_168 = *(undefined8 *)&pXVar4->value_tag;
          puStack_160 = (pXVar4->value).data_.data_;
          local_1c8 = (pXVar5->type).data_.data_;
          sStack_1c0 = (pXVar5->type).data_.size_;
          local_1b8 = *(undefined8 *)&pXVar5->value_tag;
          puStack_1b0 = (pXVar5->value).data_.data_;
          local_1a8 = (pXVar5->value).data_.size_;
          pXVar3 = pXVar5;
          local_128 = local_178;
          sStack_120 = sStack_170;
          local_118 = local_168;
          puStack_110 = puStack_160;
          local_108 = local_158;
          local_58 = local_1c8;
          sStack_50 = sStack_1c0;
          local_48 = local_1b8;
          puStack_40 = puStack_1b0;
          local_38 = local_1a8;
          if ((((uint)local_168 < 0x1f) && ((0x50481000U >> ((uint)local_168 & 0x1f) & 1) != 0)) &&
             (((uint)local_1b8 < 0x1f && ((0x50481000U >> ((uint)local_1b8 & 0x1f) & 1) != 0)))) {
            local_148._M_string_length = 0;
            local_148.field_2._M_local_buf[0] = '\0';
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            local_198._M_string_length = 0;
            local_198.field_2._M_local_buf[0] = '\0';
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            CertErrors::CertErrors(&local_70);
            attribute.type.data_.size_ = sStack_170;
            attribute.type.data_.data_ = local_178;
            attribute._16_8_ = local_168;
            attribute.value.data_.data_ = puStack_160;
            attribute.value.data_.size_ = local_158;
            bVar1 = NormalizeValue(attribute,&local_148,&local_70);
            if ((bVar1) &&
               (attribute_00.type.data_.size_ = sStack_1c0,
               attribute_00.type.data_.data_ = local_1c8, attribute_00._16_8_ = local_1b8,
               attribute_00.value.data_.data_ = puStack_1b0,
               attribute_00.value.data_.size_ = local_1a8,
               bVar1 = NormalizeValue(attribute_00,&local_198,&local_70), bVar1)) {
              _Var2 = ::std::operator==(&local_148,&local_198);
              CertErrors::~CertErrors(&local_70);
              ::std::__cxx11::string::~string((string *)&local_198);
              ::std::__cxx11::string::~string((string *)&local_148);
              if (_Var2) break;
            }
            else {
              CertErrors::~CertErrors(&local_70);
              ::std::__cxx11::string::~string((string *)&local_198);
              ::std::__cxx11::string::~string((string *)&local_148);
            }
          }
          else if (((uint)local_168 == (uint)local_1b8) &&
                  (bVar1 = bssl::der::operator==
                                     ((Input)(pXVar4->value).data_,(Input)(pXVar5->value).data_),
                  bVar1)) break;
        }
      }
      if (pXVar3 == local_208._M_impl.super__Vector_impl_data._M_finish) goto LAB_0038d713;
      pXVar5 = pXVar3 + 1;
      if (pXVar5 != local_208._M_impl.super__Vector_impl_data._M_finish) {
        memmove(pXVar3,pXVar5,
                (long)local_208._M_impl.super__Vector_impl_data._M_finish - (long)pXVar5);
      }
      local_208._M_impl.super__Vector_impl_data._M_finish =
           local_208._M_impl.super__Vector_impl_data._M_finish + -1;
    }
    ::std::_Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>::
    ~_Vector_base(&local_208);
    ::std::_Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>::
    ~_Vector_base(&local_1e8);
  }
LAB_0038d713:
  ::std::_Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>::
  ~_Vector_base(&local_208);
  ::std::_Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>::
  ~_Vector_base(&local_1e8);
  return false;
}

Assistant:

bool VerifyNameMatchInternal(der::Input a, der::Input b,
                             NameMatchType match_type) {
  // Empty Names are allowed.  RFC 5280 section 4.1.2.4 requires "The issuer
  // field MUST contain a non-empty distinguished name (DN)", while section
  // 4.1.2.6 allows for the Subject to be empty in certain cases. The caller is
  // assumed to have verified those conditions.

  // RFC 5280 section 7.1:
  // Two distinguished names DN1 and DN2 match if they have the same number of
  // RDNs, for each RDN in DN1 there is a matching RDN in DN2, and the matching
  // RDNs appear in the same order in both DNs.

  // As an optimization, first just compare the number of RDNs:
  der::Parser a_rdn_sequence_counter(a);
  der::Parser b_rdn_sequence_counter(b);
  while (a_rdn_sequence_counter.HasMore() && b_rdn_sequence_counter.HasMore()) {
    if (!a_rdn_sequence_counter.SkipTag(CBS_ASN1_SET) ||
        !b_rdn_sequence_counter.SkipTag(CBS_ASN1_SET)) {
      return false;
    }
  }
  // If doing exact match and either of the sequences has more elements than the
  // other, not a match. If doing a subtree match, the first Name may have more
  // RDNs than the second.
  if (b_rdn_sequence_counter.HasMore()) {
    return false;
  }
  if (match_type == EXACT_MATCH && a_rdn_sequence_counter.HasMore()) {
    return false;
  }

  // Verify that RDNs in |a| and |b| match.
  der::Parser a_rdn_sequence(a);
  der::Parser b_rdn_sequence(b);
  while (a_rdn_sequence.HasMore() && b_rdn_sequence.HasMore()) {
    der::Parser a_rdn, b_rdn;
    if (!a_rdn_sequence.ReadConstructed(CBS_ASN1_SET, &a_rdn) ||
        !b_rdn_sequence.ReadConstructed(CBS_ASN1_SET, &b_rdn)) {
      return false;
    }
    if (!VerifyRdnMatch(&a_rdn, &b_rdn)) {
      return false;
    }
  }

  return true;
}